

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O3

void profileMode(Problem *problem)

{
  Property *property;
  ostream *poVar1;
  ScopedPtr<Kernel::Problem> prb;
  char local_41;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  Problem *local_18;
  
  local_18 = problem;
  property = Kernel::Problem::getProperty(problem);
  Shell::Normalisation::Normalisation((Normalisation *)local_40);
  Shell::Normalisation::normalise((Normalisation *)local_40,problem);
  Shell::SymCounter::~SymCounter((SymCounter *)local_40);
  Shell::TheoryFinder::TheoryFinder((TheoryFinder *)local_40,problem->_units,property);
  Shell::TheoryFinder::search((TheoryFinder *)local_40);
  Shell::TheoryFinder::~TheoryFinder((TheoryFinder *)local_40);
  Shell::Property::categoryString_abi_cxx11_((string *)local_40,property);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_40._0_8_,local_40._8_8_);
  local_41 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_41,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_41 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_41,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,property->_atoms);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._0_8_ != &local_30) {
    operator_delete((void *)local_40._0_8_,(ulong)(local_30._M_allocated_capacity + 1));
  }
  vampireReturnValue = 0;
  Kernel::Problem::~Problem(problem);
  operator_delete(problem,0x110);
  return;
}

Assistant:

void profileMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  /* CAREFUL: Make sure that the order
   * 1) getProperty, 2) normalise, 3) TheoryFinder::search
   * is the same as in PortfolioMode::searchForProof
   * also, cf. the beginning of Preprocessing::preprocess*/
  Property* property = prb->getProperty();
  Normalisation().normalise(*prb);
  TheoryFinder(prb->units(), property).search();

  std::cout << property->categoryString() << ' ' << property->props() << ' '
	  << property->atoms() << "\n";

  //we have succeeded with the profile mode, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}